

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void initMemArray(Mem *p,int N,sqlite3 *db,u16 flags)

{
  sqlite3 **ppsVar1;
  
  ppsVar1 = &p->db;
  for (; 0 < N; N = N + -1) {
    *ppsVar1 = db;
    *(u16 *)(ppsVar1 + -4) = flags;
    *(int *)(ppsVar1 + -1) = 0;
    ppsVar1 = ppsVar1 + 7;
  }
  return;
}

Assistant:

static void initMemArray(Mem *p, int N, sqlite3 *db, u16 flags){
  while( (N--)>0 ){
    p->db = db;
    p->flags = flags;
    p->szMalloc = 0;
#ifdef SQLITE_DEBUG
    p->pScopyFrom = 0;
#endif
    p++;
  }
}